

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall
QPDF::getLinearizedParts
          (QPDF *this,ObjTable *obj,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part4,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part6,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part7,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part8,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part9)

{
  pointer pMVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part8_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part7_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part6_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part4_local;
  ObjTable *obj_local;
  QPDF *this_local;
  
  calculateLinearizationData<QPDFWriter::ObjTable>(this,obj);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=(part4,&pMVar1->part4);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=(part6,&pMVar1->part6);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=(part7,&pMVar1->part7);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=(part8,&pMVar1->part8);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=(part9,&pMVar1->part9);
  return;
}

Assistant:

void
QPDF::getLinearizedParts(
    QPDFWriter::ObjTable const& obj,
    std::vector<QPDFObjectHandle>& part4,
    std::vector<QPDFObjectHandle>& part6,
    std::vector<QPDFObjectHandle>& part7,
    std::vector<QPDFObjectHandle>& part8,
    std::vector<QPDFObjectHandle>& part9)
{
    calculateLinearizationData(obj);
    part4 = m->part4;
    part6 = m->part6;
    part7 = m->part7;
    part8 = m->part8;
    part9 = m->part9;
}